

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printNodes(PrinterStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ProcessorInstance *pPVar2;
  size_t sVar3;
  CodePrinter *pCVar4;
  pointer ppVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  char s [2];
  char local_62 [2];
  string local_60;
  PrinterStream *local_40;
  pointer local_38;
  
  ppVar5 = (this->module->processorInstances).
           super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->module->processorInstances).
             super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != local_38) {
    paVar1 = &local_60.field_2;
    local_40 = this;
    do {
      pPVar2 = ppVar5->object;
      pCVar4 = this->out;
      text._M_str = "node ";
      text._M_len = 5;
      choc::text::CodePrinter::writeBlock(pCVar4,text);
      padded(&local_60,&pPVar2->instanceName,0x10);
      text_00._M_str = local_60._M_dataplus._M_p;
      text_00._M_len = local_60._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar4,text_00);
      text_01._M_str = " = ";
      text_01._M_len = 3;
      choc::text::CodePrinter::writeBlock(pCVar4,text_01);
      text_02._M_str = (pPVar2->sourceName)._M_dataplus._M_p;
      text_02._M_len = (pPVar2->sourceName)._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar4,text_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                 local_60.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if (1 < pPVar2->arraySize) {
        pCVar4 = this->out;
        local_62[0] = '[';
        local_62[1] = '\0';
        local_60._M_dataplus._M_p = (pointer)paVar1;
        sVar3 = strlen(local_62);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_62,local_62 + sVar3);
        choc::text::CodePrinter::append(pCVar4,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                   local_60.field_2._M_allocated_capacity._0_2_) + 1);
        }
        pCVar4 = choc::text::CodePrinter::operator<<(pCVar4,pPVar2->arraySize);
        local_62[0] = ']';
        local_62[1] = '\0';
        local_60._M_dataplus._M_p = (pointer)paVar1;
        sVar3 = strlen(local_62);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_62,local_62 + sVar3);
        choc::text::CodePrinter::append(pCVar4,&local_60);
        this = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                   local_60.field_2._M_allocated_capacity._0_2_) + 1);
        }
      }
      if (((pPVar2->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged != false) ||
         (((pPVar2->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged & 1U) != 0)) {
        pCVar4 = this->out;
        text_03._M_str = " ";
        text_03._M_len = 1;
        choc::text::CodePrinter::writeBlock(pCVar4,text_03);
        ClockMultiplier::toString_abi_cxx11_(&local_60,&pPVar2->clockMultiplier);
        text_04._M_str = local_60._M_dataplus._M_p;
        text_04._M_len = local_60._M_string_length;
        choc::text::CodePrinter::writeBlock(pCVar4,text_04);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                   local_60.field_2._M_allocated_capacity._0_2_) + 1);
        }
      }
      pCVar4 = this->out;
      local_62[0] = ';';
      local_62[1] = '\0';
      local_60._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(local_62);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_62,local_62 + sVar3)
      ;
      choc::text::CodePrinter::append(pCVar4,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                 local_60.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_60.field_2._M_allocated_capacity._0_2_ = 10;
      local_60._M_string_length = 1;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      choc::text::CodePrinter::append(pCVar4,&local_60);
      this = local_40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT62(local_60.field_2._M_allocated_capacity._2_6_,
                                 local_60.field_2._M_allocated_capacity._0_2_) + 1);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_38);
  }
  return;
}

Assistant:

void printNodes()
        {
            for (auto mi : module.processorInstances)
            {
                out << "node " << padded (mi->instanceName, 16) << " = " << mi->sourceName;

                if (mi->arraySize > 1)
                    out << '[' << mi->arraySize << ']';

                if (mi->clockMultiplier.hasValue())
                    out << " " << mi->clockMultiplier.toString();

                out << ';' << newLine;
            }
        }